

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-routing.c
# Opt level: O2

void mpr_calculate_neighbor_graph_routing(nhdp_domain *domain,neighbor_graph *graph)

{
  list_entity **neigh;
  list_entity *plVar1;
  uint32_t *puVar2;
  oonf_log_source oVar3;
  _Bool _Var4;
  list_entity *plVar5;
  list_entity *plVar6;
  undefined8 uVar7;
  uint32_t *puVar8;
  undefined8 uVar9;
  neighbor_graph *pnVar10;
  uint32_t *puVar11;
  ulong uVar12;
  long lVar13;
  netaddr_str nbuf1;
  undefined1 local_6e [62];
  
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x148,0,0,0x639a);
  }
  mpr_init_neighbor_graph(graph,&_rt_api_interface);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0xfa,0,0,0x63c4);
  }
  plVar5 = nhdp_db_get_neigh_list();
  while( true ) {
    plVar5 = plVar5->next;
    plVar1 = plVar5->prev;
    plVar6 = nhdp_db_get_neigh_list();
    if (plVar1 == plVar6->prev) break;
    neigh = &plVar5[-10].prev;
    *(undefined1 *)((long)&plVar5[-8].prev + 4) = 0;
    _Var4 = _is_allowed_neighbor_tuple(domain,(nhdp_neighbor *)neigh);
    if (_Var4) {
      uVar12 = (ulong)LOG_MPR;
      if (((&log_global_mask)[uVar12] & 1) != 0) {
        uVar7 = netaddr_to_prefixstring(&nbuf1,neigh,0);
        oonf_log(1,uVar12,"src/nhdp/mpr/neighbor-graph-routing.c",0x102,0,0,"Add neighbor %s in: %u"
                 ,uVar7,(short)*(undefined4 *)&plVar5[(long)domain->index * 2 + 4].prev);
      }
      mpr_add_n1_node_to_set(&graph->set_n1,(nhdp_neighbor *)neigh,(nhdp_link *)0x0,0);
    }
  }
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x114,0,0,0x63f9);
  }
  pnVar10 = graph;
  while (pnVar10 = (neighbor_graph *)(pnVar10->set_n1).list_head.next,
        (pnVar10->set_n1).list_head.prev != (graph->set_n1).list_head.prev) {
    puVar8 = pnVar10[-1].d_x_y_cache;
    puVar11 = puVar8 + 0xe;
    while (puVar11 = *(uint32_t **)puVar11, *(long *)(puVar11 + 2) != *(long *)(puVar8 + 0x10)) {
      puVar8 = puVar11 + -0x12;
      while (oVar3 = LOG_MPR, puVar8 = *(uint32_t **)puVar8,
            *(long *)(puVar8 + 2) != *(long *)(puVar11 + -0x10)) {
        lVar13 = (long)domain->index;
        if (puVar8[lVar13 * 3 + 0x1c] < 0xffff01) {
          if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
            puVar2 = pnVar10[-1].d_x_y_cache;
            uVar7 = netaddr_to_prefixstring(&nbuf1,(netaddr *)(puVar8 + -0x20),0);
            uVar9 = netaddr_to_prefixstring(local_6e,&pnVar10[-1].set_mpr_candidates.root,0);
            oonf_log(1,oVar3,"src/nhdp/mpr/neighbor-graph-routing.c",0x128,0,0,
                     "Add twohop addr %s (over %s) in: %u out: %u (path-in: %u path-out: %u)",uVar7,
                     uVar9,puVar8[lVar13 * 3 + 0x1c],puVar8[lVar13 * 3 + 0x1d],
                     puVar2[lVar13 * 8 + 0x38] + puVar8[lVar13 * 3 + 0x1c],
                     (short)(puVar2[lVar13 * 8 + 0x39] + puVar8[lVar13 * 3 + 0x1d]));
          }
          mpr_add_addr_node_to_set(&graph->set_n2,*(netaddr *)(puVar8 + -0x20),0);
        }
      }
      puVar8 = pnVar10[-1].d_x_y_cache;
    }
  }
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_routing(const struct nhdp_domain *domain, struct neighbor_graph *graph) {
  struct neighbor_graph_interface *methods;

  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for routing MPRs");

  methods = _get_neighbor_graph_interface_routing();

  mpr_init_neighbor_graph(graph, methods);
  _calculate_n1(domain, graph);
  _calculate_n2(domain, graph);
}